

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderHeatmap<unsigned_int,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,uint *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  double dVar4;
  ImPlotContext *pIVar5;
  ImU32 IVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImVec4 IVar17;
  double local_138;
  TransformerLinLog transformer_local;
  ImVec2 a;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  ImVec2 local_80;
  ImVec2 b;
  undefined8 uStack_70;
  ImVec4 color;
  
  pIVar5 = GImPlot;
  auVar16._0_8_ = (double)cols;
  auVar16._8_8_ = (double)rows;
  auVar15._0_8_ = bounds_max->x - bounds_min->x;
  auVar15._8_8_ = bounds_max->y - bounds_min->y;
  auVar16 = divpd(auVar15,auVar16);
  dVar14 = auVar16._0_8_;
  dVar12 = auVar16._8_8_;
  iVar7 = 0;
  if (cols < 1) {
    cols = iVar7;
  }
  if (rows < 1) {
    rows = 0;
  }
  local_138 = 0.0;
  lVar9 = 0;
  transformer_local.YAxis = transformer.YAxis;
  for (; iVar7 != rows; iVar7 = iVar7 + 1) {
    lVar9 = (long)(int)lVar9;
    dVar11 = 0.0;
    iVar8 = cols;
    while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
      dVar13 = dVar11 * dVar14 + bounds_min->x + dVar14 * 0.5;
      dVar1 = bounds_max->y - (dVar12 * local_138 + dVar12 * 0.5);
      dVar4 = dVar1 - dVar12 * 0.5;
      color.z = (float)SUB84(dVar4,0);
      color._0_8_ = dVar13 - dVar14 * 0.5;
      color.w = (float)((ulong)dVar4 >> 0x20);
      a = TransformerLinLog::operator()(&transformer_local,(ImPlotPoint *)&color);
      dVar1 = dVar1 + dVar12 * 0.5;
      color.z = (float)SUB84(dVar1,0);
      color._0_8_ = dVar13 + dVar14 * 0.5;
      color.w = (float)((ulong)dVar1 >> 0x20);
      IVar2 = TransformerLinLog::operator()(&transformer_local,(ImPlotPoint *)&color);
      b = IVar2;
      IVar17 = LerpColormap((float)(((double)values[lVar9] - scale_min) / (scale_max - scale_min) +
                                   0.0));
      color._0_12_ = IVar17._0_12_;
      color.w = IVar17.w * (pIVar5->Style).FillAlpha;
      IVar6 = ImGui::GetColorU32(&color);
      ImDrawList::AddRectFilled(DrawList,&a,&b,IVar6,0.0,0xf);
      lVar9 = lVar9 + 1;
      dVar11 = dVar11 + 1.0;
    }
    local_138 = local_138 + 1.0;
  }
  if (fmt != (char *)0x0) {
    lVar9 = 0;
    for (iVar7 = 0; iVar7 != rows; iVar7 = iVar7 + 1) {
      lVar9 = (long)(int)lVar9;
      dVar12 = 0.0;
      iVar8 = cols;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        a = (ImVec2)(dVar12 * dVar14 + bounds_min->x + dVar14 * 0.5);
        IVar2 = TransformerLinLog::operator()(&transformer_local,(ImPlotPoint *)&a);
        sprintf((char *)&color,fmt,(ulong)values[lVar9]);
        IVar3 = ImGui::CalcTextSize((char *)&color,(char *)0x0,false,-1.0);
        _b = LerpColormap((float)(((double)values[lVar9] - scale_min) / (scale_max - scale_min) +
                                 0.0));
        IVar6 = CalcTextColor((ImVec4 *)&b);
        local_a8 = IVar3.x;
        fStack_a4 = IVar3.y;
        local_98 = IVar2.x;
        fStack_94 = IVar2.y;
        local_80.y = fStack_a4 * -0.5 + fStack_94;
        local_80.x = local_a8 * -0.5 + local_98;
        ImDrawList::AddText(DrawList,&local_80,IVar6,(char *)&color,(char *)0x0);
        lVar9 = lVar9 + 1;
        dVar12 = dVar12 + 1.0;
      }
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}